

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O3

void __thiscall
duckdb::DuckTransaction::PushAppend
          (DuckTransaction *this,DataTable *table,idx_t start_row,idx_t row_count)

{
  data_ptr_t pdVar1;
  UndoBufferReference undo_entry;
  UndoBufferReference UStack_48;
  
  ModifyTable(this,table);
  UndoBuffer::CreateEntry(&UStack_48,&this->undo_buffer,INSERT_TUPLE,0x18);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&UStack_48.handle.node);
  pdVar1 = (UStack_48.handle.node.ptr)->buffer;
  *(DataTable **)(pdVar1 + UStack_48.position) = table;
  *(idx_t *)(pdVar1 + UStack_48.position + 8) = start_row;
  *(idx_t *)(pdVar1 + UStack_48.position + 0x10) = row_count;
  BufferHandle::~BufferHandle(&UStack_48.handle);
  return;
}

Assistant:

void DuckTransaction::PushAppend(DataTable &table, idx_t start_row, idx_t row_count) {
	ModifyTable(table);
	auto undo_entry = undo_buffer.CreateEntry(UndoFlags::INSERT_TUPLE, sizeof(AppendInfo));
	auto append_info = reinterpret_cast<AppendInfo *>(undo_entry.Ptr());
	append_info->table = &table;
	append_info->start_row = start_row;
	append_info->count = row_count;
}